

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)10>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  long lVar5;
  uint uVar6;
  float fVar7;
  
  if (0 < count) {
    pbVar4 = src + (long)index * 3 + 2;
    lVar5 = 0;
    do {
      bVar2 = *pbVar4;
      bVar3 = pbVar4[-1];
      uVar6 = (uint)pbVar4[-2] * 0x10000;
      fVar7 = (float)((uint)(pbVar4[-2] >> 2) * 0x4100000 >> 0x18) * 0.003921569;
      pfVar1 = (float *)((long)&buffer->r + lVar5);
      *pfVar1 = (float)((uVar6 & 0x30000 | (uVar6 + (uint)bVar3 * 0x100) * 0x40 & 0xfc0000) >> 0x10)
                * 0.003921569 * fVar7;
      pfVar1[1] = fVar7 * (float)(((bVar3 & 0xc) << 6 | (CONCAT11(bVar3,bVar2) & 0xfc0) << 4) >> 8)
                          * 0.003921569;
      pfVar1[2] = (float)(byte)(bVar2 >> 4 & 3 | bVar2 * '\x04') * 0.003921569 * fVar7;
      pfVar1[3] = fVar7;
      pbVar4 = pbVar4 + 3;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar5);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}